

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImage.cpp
# Opt level: O3

void __thiscall Imf_2_5::PreviewImage::PreviewImage(PreviewImage *this,PreviewImage *other)

{
  uint uVar1;
  PreviewRgba *pPVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  
  uVar1 = other->_width;
  this->_width = uVar1;
  uVar5 = other->_height;
  this->_height = uVar5;
  uVar5 = uVar5 * uVar1;
  uVar3 = (ulong)uVar5 * 4;
  pPVar2 = (PreviewRgba *)operator_new__(uVar3);
  if (uVar5 == 0) {
    this->_pixels = pPVar2;
  }
  else {
    lVar4 = 0;
    do {
      *(undefined4 *)(&pPVar2->r + lVar4) = 0xff000000;
      lVar4 = lVar4 + 4;
    } while (uVar3 - lVar4 != 0);
    this->_pixels = pPVar2;
    if ((ulong)uVar5 != 0) {
      uVar3 = 0;
      do {
        this->_pixels[uVar3] = other->_pixels[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->_height * this->_width);
    }
  }
  return;
}

Assistant:

PreviewImage::PreviewImage (const PreviewImage &other):
    _width (other._width),
    _height (other._height),
    _pixels (new PreviewRgba [other._width * other._height])
{
    for (unsigned int i = 0; i < _width * _height; ++i)
	_pixels[i] = other._pixels[i];
}